

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGeneratorFunction.cpp
# Opt level: O3

BOOL __thiscall
Js::JavascriptGeneratorFunction::SetProperty
          (JavascriptGeneratorFunction *this,JavascriptString *propertyNameString,Var value,
          PropertyOperationFlags flags,PropertyValueInfo *info)

{
  BOOL BVar1;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord;
  
  propertyRecord = (PropertyRecord *)info;
  ScriptContext::FindPropertyRecord
            ((((((this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
                 super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr,propertyNameString,&local_40);
  if ((local_40 == (PropertyRecord *)0x0) || ((local_40->pid | 2U) != 0x1cf)) {
    BVar1 = JavascriptFunction::SetProperty
                      ((JavascriptFunction *)this,propertyNameString,value,flags,
                       (PropertyValueInfo *)propertyRecord);
  }
  else {
    BVar1 = DynamicObject::SetProperty
                      ((DynamicObject *)this,propertyNameString,value,flags,
                       (PropertyValueInfo *)propertyRecord);
  }
  return BVar1;
}

Assistant:

BOOL JavascriptGeneratorFunction::SetProperty(JavascriptString* propertyNameString, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        PropertyRecord const* propertyRecord;
        this->GetScriptContext()->FindPropertyRecord(propertyNameString, &propertyRecord);

        if (propertyRecord != nullptr)
        {
            if (propertyRecord->GetPropertyId() == PropertyIds::caller || propertyRecord->GetPropertyId() == PropertyIds::arguments)
            {
                // JavascriptFunction has special case for caller and arguments; call DynamicObject:: virtual directly to skip that.
                return DynamicObject::SetProperty(propertyNameString, value, flags, info);
            }
        }

        return JavascriptFunction::SetProperty(propertyNameString, value, flags, info);
    }